

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O3

int32_t __thiscall
fasttext::Dictionary::getLine
          (Dictionary *this,istream *in,vector<int,_std::allocator<int>_> *words,minstd_rand *rng)

{
  pointer piVar1;
  iterator __position;
  bool bVar2;
  entry_type eVar3;
  int32_t iVar4;
  int iVar5;
  int iVar6;
  Dictionary *this_00;
  double dVar7;
  int32_t wid;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_48271UL,_0UL,_2147483647UL>,_double>
  __aurng;
  string token;
  int32_t local_5c;
  minstd_rand *local_58;
  undefined1 local_50 [32];
  
  local_50._0_8_ = local_50 + 0x10;
  local_50._8_8_ = 0;
  local_50[0x10] = '\0';
  this_00 = this;
  local_58 = rng;
  reset(this,in);
  piVar1 = (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = piVar1;
  }
  iVar6 = 0;
  while (bVar2 = readWord(this_00,in,(string *)local_50), bVar2) {
    this_00 = this;
    iVar4 = find(this,(string *)local_50);
    local_5c = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[iVar4];
    if (-1 < local_5c) {
      this_00 = this;
      eVar3 = getType(this,local_5c);
      iVar4 = local_5c;
      if (eVar3 == word) {
        dVar7 = std::
                generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,48271ul,0ul,2147483647ul>>
                          (local_58);
        this_00 = this;
        bVar2 = discard(this,iVar4,(float)(dVar7 + 0.0));
        if (!bVar2) {
          __position._M_current =
               (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            this_00 = (Dictionary *)words;
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)words,__position,&local_5c);
          }
          else {
            *__position._M_current = local_5c;
            (words->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish = __position._M_current + 1;
          }
        }
      }
      iVar5 = iVar6 + 1;
      bVar2 = 0x3ff < iVar6;
      iVar6 = iVar5;
      if ((bVar2) ||
         ((local_50._8_8_ == DAT_0014e298 &&
          ((local_50._8_8_ == 0 ||
           (this_00 = (Dictionary *)local_50._0_8_,
           iVar5 = bcmp((void *)local_50._0_8_,EOS_abi_cxx11_,local_50._8_8_), iVar5 == 0))))))
      break;
    }
  }
  if ((Dictionary *)local_50._0_8_ != (Dictionary *)(local_50 + 0x10)) {
    operator_delete((void *)local_50._0_8_);
  }
  return iVar6;
}

Assistant:

int32_t Dictionary::getLine(
    std::istream& in,
    std::vector<int32_t>& words,
    std::minstd_rand& rng) const {
  std::uniform_real_distribution<> uniform(0, 1);
  std::string token;
  int32_t ntokens = 0;

  reset(in);
  words.clear();
  while (readWord(in, token)) {
    int32_t h = find(token);
    int32_t wid = word2int_[h];
    if (wid < 0) {
      continue;
    }

    ntokens++;
    if (getType(wid) == entry_type::word && !discard(wid, uniform(rng))) {
      words.push_back(wid);
    }
    if (ntokens > MAX_LINE_SIZE || token == EOS) {
      break;
    }
  }
  return ntokens;
}